

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_decimal.cpp
# Opt level: O1

void __thiscall
icu_63::numparse::impl::DecimalMatcher::DecimalMatcher
          (DecimalMatcher *this,DecimalFormatSymbols *symbols,Grouper *grouper,
          parse_flags_t parseFlags)

{
  int c;
  UBool UVar1;
  byte bVar2;
  int16_t iVar3;
  Key KVar4;
  int32_t iVar5;
  UChar32 c_00;
  UnicodeSet *pUVar6;
  UnicodeSet *pUVar7;
  undefined8 *puVar8;
  Key KVar9;
  UnicodeString *src;
  long lVar10;
  UnicodeString *pUVar11;
  UnicodeString local_70;
  
  (this->super_NumberParseMatcher)._vptr_NumberParseMatcher =
       (_func_int **)&PTR__DecimalMatcher_00480188;
  (this->groupingSeparator).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_0048be70;
  (this->groupingSeparator).fUnion.fStackFields.fLengthAndFlags = 2;
  pUVar11 = &this->decimalSeparator;
  (this->decimalSeparator).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_0048be70;
  (this->decimalSeparator).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fLocalDecimalUniSet).super_LocalPointerBase<const_icu_63::UnicodeSet>.ptr =
       (UnicodeSet *)0x0;
  (this->fLocalSeparatorSet).super_LocalPointerBase<const_icu_63::UnicodeSet>.ptr =
       (UnicodeSet *)0x0;
  (this->fLocalDigitStrings).super_LocalPointerBase<const_icu_63::UnicodeString>.ptr =
       (UnicodeString *)0x0;
  if ((parseFlags & 2U) == 0) {
    lVar10 = 8;
    icu_63::UnicodeString::operator=(&this->groupingSeparator,(UnicodeString *)&symbols->field_0x48)
    ;
  }
  else {
    lVar10 = 0x288;
    icu_63::UnicodeString::operator=
              (&this->groupingSeparator,(UnicodeString *)&symbols->field_0x448);
  }
  icu_63::UnicodeString::operator=
            (pUVar11,(UnicodeString *)((long)&(symbols->super_UObject)._vptr_UObject + lVar10));
  pUVar6 = unisets::get(STRICT_ALL_SEPARATORS - (uint)((parseFlags & 4U) == 0));
  this->groupingUniSet = pUVar6;
  icu_63::UnicodeString::UnicodeString(&local_70,pUVar11);
  KVar9 = (uint)parseFlags >> 1 & STRICT_IGNORABLES;
  KVar4 = KVar9 + COMMA;
  pUVar6 = (UnicodeSet *)(ulong)(uint)KVar4;
  KVar4 = unisets::chooseFrom(&local_70,KVar4,KVar9 | PERIOD);
  icu_63::UnicodeString::~UnicodeString(&local_70);
  if (KVar4 < EMPTY) {
    if ((ushort)(this->decimalSeparator).fUnion.fStackFields.fLengthAndFlags < 0x20) {
      pUVar7 = unisets::get(EMPTY);
      goto LAB_00306ae9;
    }
    pUVar6 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar6);
    if (pUVar6 == (UnicodeSet *)0x0) {
      pUVar6 = (UnicodeSet *)0x0;
    }
    else {
      UnicodeSet::UnicodeSet(pUVar6);
    }
    c_00 = icu_63::UnicodeString::char32At(pUVar11,0);
    UnicodeSet::add(pUVar6,c_00);
    UnicodeSet::freeze(pUVar6);
    this->decimalUniSet = pUVar6;
    LocalPointer<const_icu_63::UnicodeSet>::adoptInstead(&this->fLocalDecimalUniSet,pUVar6);
  }
  else {
    pUVar7 = unisets::get(KVar4);
LAB_00306ae9:
    this->decimalUniSet = pUVar7;
  }
  if (KVar4 < EMPTY) {
    pUVar6 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar6);
    UnicodeSet::UnicodeSet(pUVar6);
    UnicodeSet::addAll(pUVar6,this->groupingUniSet);
    UnicodeSet::addAll(pUVar6,this->decimalUniSet);
    UnicodeSet::freeze(pUVar6);
    this->separatorSet = pUVar6;
    LocalPointer<const_icu_63::UnicodeSet>::adoptInstead(&this->fLocalSeparatorSet,pUVar6);
    pUVar7 = (UnicodeSet *)0x0;
  }
  else {
    this->separatorSet = this->groupingUniSet;
    pUVar7 = unisets::get((uint)((parseFlags & 4U) == 0) + DIGITS_OR_ALL_SEPARATORS);
  }
  this->leadSet = pUVar7;
  c = symbols->fCodePointZero;
  if (c != -1) {
    UVar1 = u_isdigit_63(c);
    if (UVar1 != '\0') {
      pUVar6 = (UnicodeSet *)0xa;
      iVar5 = u_digit_63(c,'\n');
      if (iVar5 == 0) goto LAB_00306c13;
    }
  }
  puVar8 = (undefined8 *)UMemory::operator_new__((UMemory *)0x288,(size_t)pUVar6);
  if (puVar8 == (undefined8 *)0x0) {
    pUVar11 = (UnicodeString *)0x0;
  }
  else {
    *puVar8 = 10;
    lVar10 = 0x10;
    do {
      *(undefined ***)((long)puVar8 + lVar10 + -8) = &PTR__UnicodeString_0048be70;
      *(undefined2 *)((long)puVar8 + lVar10) = 2;
      lVar10 = lVar10 + 0x40;
    } while (lVar10 != 0x290);
    pUVar11 = (UnicodeString *)(puVar8 + 1);
  }
  LocalArray<const_icu_63::UnicodeString>::adoptInstead(&this->fLocalDigitStrings,pUVar11);
  lVar10 = 0;
  do {
    src = (UnicodeString *)(&symbols->field_0x448 + lVar10);
    if (lVar10 == 0) {
      src = (UnicodeString *)&symbols->field_0x108;
    }
    icu_63::UnicodeString::operator=
              ((UnicodeString *)
               ((long)&(pUVar11->super_Replaceable).super_UObject._vptr_UObject + lVar10),src);
    lVar10 = lVar10 + 0x40;
  } while (lVar10 != 0x280);
LAB_00306c13:
  bVar2 = (byte)parseFlags;
  this->requireGroupingMatch = (bool)(bVar2 >> 3 & 1);
  this->groupingDisabled = (bool)(bVar2 >> 5 & 1);
  this->integerOnly = (bool)(bVar2 >> 4 & 1);
  iVar3 = icu_63::number::impl::Grouper::getPrimary(grouper);
  this->grouping1 = iVar3;
  iVar3 = icu_63::number::impl::Grouper::getSecondary(grouper);
  this->grouping2 = iVar3;
  return;
}

Assistant:

DecimalMatcher::DecimalMatcher(const DecimalFormatSymbols& symbols, const Grouper& grouper,
                               parse_flags_t parseFlags) {
    if (0 != (parseFlags & PARSE_FLAG_MONETARY_SEPARATORS)) {
        groupingSeparator = symbols.getConstSymbol(DecimalFormatSymbols::kMonetaryGroupingSeparatorSymbol);
        decimalSeparator = symbols.getConstSymbol(DecimalFormatSymbols::kMonetarySeparatorSymbol);
    } else {
        groupingSeparator = symbols.getConstSymbol(DecimalFormatSymbols::kGroupingSeparatorSymbol);
        decimalSeparator = symbols.getConstSymbol(DecimalFormatSymbols::kDecimalSeparatorSymbol);
    }
    bool strictSeparators = 0 != (parseFlags & PARSE_FLAG_STRICT_SEPARATORS);
    unisets::Key groupingKey = strictSeparators ? unisets::STRICT_ALL_SEPARATORS
                                                : unisets::ALL_SEPARATORS;

    // Attempt to find separators in the static cache

    groupingUniSet = unisets::get(groupingKey);
    unisets::Key decimalKey = unisets::chooseFrom(
            decimalSeparator,
            strictSeparators ? unisets::STRICT_COMMA : unisets::COMMA,
            strictSeparators ? unisets::STRICT_PERIOD : unisets::PERIOD);
    if (decimalKey >= 0) {
        decimalUniSet = unisets::get(decimalKey);
    } else if (!decimalSeparator.isEmpty()) {
        auto* set = new UnicodeSet();
        set->add(decimalSeparator.char32At(0));
        set->freeze();
        decimalUniSet = set;
        fLocalDecimalUniSet.adoptInstead(set);
    } else {
        decimalUniSet = unisets::get(unisets::EMPTY);
    }

    if (groupingKey >= 0 && decimalKey >= 0) {
        // Everything is available in the static cache
        separatorSet = groupingUniSet;
        leadSet = unisets::get(
                strictSeparators ? unisets::DIGITS_OR_ALL_SEPARATORS
                                 : unisets::DIGITS_OR_STRICT_ALL_SEPARATORS);
    } else {
        auto* set = new UnicodeSet();
        set->addAll(*groupingUniSet);
        set->addAll(*decimalUniSet);
        set->freeze();
        separatorSet = set;
        fLocalSeparatorSet.adoptInstead(set);
        leadSet = nullptr;
    }

    UChar32 cpZero = symbols.getCodePointZero();
    if (cpZero == -1 || !u_isdigit(cpZero) || u_digit(cpZero, 10) != 0) {
        // Uncommon case: okay to allocate.
        auto digitStrings = new UnicodeString[10];
        fLocalDigitStrings.adoptInstead(digitStrings);
        for (int32_t i = 0; i <= 9; i++) {
            digitStrings[i] = symbols.getConstDigitSymbol(i);
        }
    }

    requireGroupingMatch = 0 != (parseFlags & PARSE_FLAG_STRICT_GROUPING_SIZE);
    groupingDisabled = 0 != (parseFlags & PARSE_FLAG_GROUPING_DISABLED);
    integerOnly = 0 != (parseFlags & PARSE_FLAG_INTEGER_ONLY);
    grouping1 = grouper.getPrimary();
    grouping2 = grouper.getSecondary();

    // Fraction grouping parsing is disabled for now but could be enabled later.
    // See http://bugs.icu-project.org/trac/ticket/10794
    // fractionGrouping = 0 != (parseFlags & PARSE_FLAG_FRACTION_GROUPING_ENABLED);
}